

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Widget.cxx
# Opt level: O0

void __thiscall Fl_Widget::do_callback(Fl_Widget *this,Fl_Widget *o,void *arg)

{
  int iVar1;
  Fl_Widget_Tracker local_28;
  Fl_Widget_Tracker wp;
  void *arg_local;
  Fl_Widget *o_local;
  Fl_Widget *this_local;
  
  if (this->callback_ != (Fl_Callback *)0x0) {
    wp.wp_ = (Fl_Widget *)arg;
    Fl_Widget_Tracker::Fl_Widget_Tracker(&local_28,this);
    (*this->callback_)(o,wp.wp_);
    iVar1 = Fl_Widget_Tracker::deleted(&local_28);
    if ((iVar1 == 0) && (this->callback_ != default_callback)) {
      clear_changed(this);
    }
    Fl_Widget_Tracker::~Fl_Widget_Tracker(&local_28);
  }
  return;
}

Assistant:

void
Fl_Widget::do_callback(Fl_Widget* o,void* arg) {
  if (!callback_) return;
  Fl_Widget_Tracker wp(this);
  callback_(o,arg);
  if (wp.deleted()) return;
  if (callback_ != default_callback)
    clear_changed();
}